

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stb_ps * stb_ps_remove(stb_ps *ps,void *value)

{
  undefined8 uVar1;
  int *piVar2;
  stb_ps_hash *psVar3;
  undefined8 *puVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  stb_ps *psVar9;
  long lVar10;
  stb_ps *psVar11;
  long lVar12;
  stb_ps *psVar13;
  stb_ps *psVar14;
  int iVar15;
  
  if (((ulong)value & 3) != 0) {
    __assert_fail("(3 & (int) value) == STB_ps_direct",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x1e7a,"stb_ps *stb_ps_remove(stb_ps *, void *)");
  }
  if (value != (void *)0x0) {
    switch((uint)ps & 3) {
    case 0:
      if (ps == (stb_ps *)value) {
        ps = (stb_ps *)0x0;
      }
      break;
    case 1:
      psVar14 = *(stb_ps **)(ps + -1);
      if (psVar14 == (stb_ps *)value) {
        *(undefined8 *)(ps + -1) = 0;
        psVar14 = (stb_ps *)0x0;
        uVar6 = 0;
      }
      else {
        uVar6 = (uint)(psVar14 != (stb_ps *)0x0);
      }
      psVar9 = *(stb_ps **)(ps + 7);
      if (psVar9 == (stb_ps *)value) {
        *(undefined8 *)(ps + 7) = 0;
        psVar9 = (stb_ps *)0x0;
      }
      else {
        uVar6 = (uVar6 + 1) - (uint)(psVar9 == (stb_ps *)0x0);
      }
      psVar11 = *(stb_ps **)(ps + 0xf);
      if (psVar11 == (stb_ps *)value) {
        *(undefined8 *)(ps + 0xf) = 0;
        psVar11 = (stb_ps *)0x0;
      }
      else {
        uVar6 = (uVar6 + 1) - (uint)(psVar11 == (stb_ps *)0x0);
      }
      psVar13 = *(stb_ps **)(ps + 0x17);
      if (psVar13 == (stb_ps *)value) {
        *(undefined8 *)(ps + 0x17) = 0;
        psVar13 = (stb_ps *)0x0;
      }
      else {
        uVar6 = (uVar6 + 1) - (uint)(psVar13 == (stb_ps *)0x0);
      }
      if (uVar6 == 1) {
        if ((((psVar14 == (stb_ps *)0x0) && (psVar14 = psVar9, psVar9 == (stb_ps *)0x0)) &&
            (psVar14 = psVar11, psVar11 == (stb_ps *)0x0)) &&
           (psVar14 = psVar13, psVar13 == (stb_ps *)0x0)) {
          __assert_fail("value != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1e8c,"stb_ps *stb_ps_remove(stb_ps *, void *)");
        }
        free(ps + -1);
        ps = psVar14;
      }
      break;
    case 2:
      lVar10 = (long)*(int *)(ps + -2);
      if (0 < lVar10) {
        lVar12 = 0;
        do {
          if (*(void **)(ps + lVar12 * 8 + 6) == value) {
            iVar5 = *(int *)(ps + -2) + -1;
            *(int *)(ps + -2) = iVar5;
            *(undefined8 *)(ps + lVar12 * 8 + 6) = *(undefined8 *)(ps + lVar10 * 8 + -2);
            if (iVar5 != 3) {
              return ps;
            }
            puVar4 = (undefined8 *)malloc(0x20);
            uVar1 = *(undefined8 *)(ps + 0xe);
            *puVar4 = *(undefined8 *)(ps + 6);
            puVar4[1] = uVar1;
            puVar4[2] = *(undefined8 *)(ps + 0x16);
            puVar4[3] = 0;
            free(ps + -2);
            return (stb_ps *)((long)puVar4 + 1);
          }
          lVar12 = lVar12 + 1;
        } while (lVar10 != lVar12);
      }
      break;
    case 3:
      iVar5 = ((uint)((ulong)value >> 0x13) & 0x1fff) +
              ((uint)((ulong)value >> 6) & 0x3ffffff) + (int)value;
      uVar6 = iVar5 * 0x80008 ^ iVar5 * 0x10001;
      uVar6 = (uVar6 >> 5) + uVar6;
      uVar6 = uVar6 * 4 ^ uVar6;
      uVar6 = (uVar6 >> 0xf) + uVar6;
      uVar6 = uVar6 * 0x400 ^ uVar6;
      uVar6 = (uVar6 >> 0x13) + (uVar6 >> 6) + uVar6;
      uVar8 = (ulong)(*(uint *)(ps + 1) & uVar6);
      psVar14 = ps + 0x1d;
      if (*(void **)(ps + uVar8 * 8 + 0x1d) != value) {
        do {
          uVar8 = (ulong)((int)uVar8 + ((uVar6 >> 0x13) + (uVar6 >> 6) + uVar6 | 1) &
                         *(uint *)(ps + 1));
        } while (*(void **)(psVar14 + uVar8 * 8) != value);
      }
      psVar9 = ps + -3;
      *(undefined8 *)(ps + uVar8 * 8 + 0x1d) = 1;
      uVar1 = *(undefined8 *)(ps + 5);
      iVar15 = (int)uVar1;
      iVar5 = iVar15 + -1;
      *(int *)(ps + 5) = iVar5;
      *(int *)(ps + 9) = (int)((ulong)uVar1 >> 0x20) + 1;
      if (iVar15 < 9) {
        piVar2 = (int *)malloc(0x48);
        iVar15 = *(int *)psVar9;
        if ((long)iVar15 < 1) {
          iVar7 = 0;
        }
        else {
          lVar10 = 0;
          iVar7 = 0;
          do {
            if ((*(ulong *)(psVar14 + lVar10 * 8) & 0xfffffffe) != 0) {
              lVar12 = (long)iVar7;
              iVar7 = iVar7 + 1;
              *(ulong *)(piVar2 + lVar12 * 2 + 2) = *(ulong *)(psVar14 + lVar10 * 8);
            }
            lVar10 = lVar10 + 1;
          } while (iVar15 != lVar10);
        }
        if (iVar7 != iVar5) {
          __assert_fail("j == h->count",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                        ,0x1eb9,"stb_ps *stb_ps_remove(stb_ps *, void *)");
        }
        *piVar2 = iVar5;
        free(psVar9);
        ps = (stb_ps *)((long)piVar2 + 2);
      }
      else if (iVar5 == *(int *)(ps + 0x11)) {
        psVar3 = stb_ps_makehash(*(int *)psVar9 >> 1,*(int *)psVar9,(void **)psVar14);
        free(psVar9);
        ps = (stb_ps *)((long)&psVar3->size + 3);
      }
    }
  }
  return ps;
}

Assistant:

stb_ps *stb_ps_remove(stb_ps *ps, void *value)
{
   #ifdef STB_DEBUG
   assert(stb_ps_find(ps, value));
   #endif
   assert((3 & (int) value) == STB_ps_direct);
   if (value == NULL) return ps; // ignore NULL removes to avoid bad breakage
   switch (3 & (int) ps) {
      case STB_ps_direct:
         return ps == value ? NULL : ps;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         int count=0;
         assert(STB_BUCKET_SIZE == 4);
         if (b->p[0] == value) b->p[0] = NULL; else count += (b->p[0] != NULL);
         if (b->p[1] == value) b->p[1] = NULL; else count += (b->p[1] != NULL);
         if (b->p[2] == value) b->p[2] = NULL; else count += (b->p[2] != NULL);
         if (b->p[3] == value) b->p[3] = NULL; else count += (b->p[3] != NULL);
         if (count == 1) { // shrink bucket at size 1
            value = b->p[0];
            if (value == NULL) value = b->p[1];
            if (value == NULL) value = b->p[2];
            if (value == NULL) value = b->p[3];
            assert(value != NULL);
            stb_bucket_free(b);
            return (stb_ps *) value; // return STB_ps_direct of value
         }
         return ps;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         int i;
         for (i=0; i < a->count; ++i) {
            if (a->p[i] == value) {
               a->p[i] = a->p[--a->count];
               if (a->count == 3) { // shrink to bucket!
                  stb_ps_bucket *b = stb_bucket_create3(a->p);
                  free(a);
                  return EncodeBucket(b);
               }
               return ps;
            }
         }
         return ps;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         stb_uint32 hash = stb_hashptr(value);
         stb_uint32 s, n = hash & h->mask;
         void **t = h->table;
         if (t[n] != value) {
            s = stb_rehash(hash) | 1;
            do {
               n = (n + s) & h->mask;
            } while (t[n] != value);
         }
         t[n] = STB_DEL;
         -- h->count;
         ++ h->count_deletes;
         // should we shrink down to an array?
         if (h->count < stb_ps_array_max) {
            int n = 1 << stb_log2_floor(stb_ps_array_max);
            if (h->count < n) {
               stb_ps_array *a = (stb_ps_array *) malloc(sizeof(*a) + (n-1) * sizeof(a->p[0]));
               int i,j=0;
               for (i=0; i < h->size; ++i)
                  if (!stb_ps_empty(t[i]))
                     a->p[j++] = t[i];
               assert(j == h->count);
               a->count = j;
               free(h);
               return EncodeArray(a);
            }
         }
         if (h->count == h->shrink_threshhold) {
            stb_ps_hash *h2 = stb_ps_makehash(h->size >> 1, h->size, t);
            free(h);
            return EncodeHash(h2);
         }
         return ps;
      }
   }
   return ps; /* NOTREACHED */
}